

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O0

string * num_to_roman_abi_cxx11_(string *__return_storage_ptr__,uint32_t num)

{
  bool bVar1;
  long lVar2;
  iterator __first;
  iterator __last;
  __type _Var3;
  string local_248;
  reference local_228;
  uint *n;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  ostringstream oss;
  value_type_conflict1 local_7c;
  uint local_78;
  uint32_t curr;
  uint local_64;
  int local_60;
  uint32_t div;
  int i;
  uint32_t prev;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nums;
  size_type size;
  uint32_t num_local;
  
  std::__cxx11::to_string
            ((string *)
             &nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,num);
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::~string
            ((string *)
             &nums.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  div = 0;
  for (local_60 = 0; local_60 != lVar2; local_60 = local_60 + 1) {
    _Var3 = std::pow<int,int>(10,local_60 + 1);
    local_64 = (uint)(long)_Var3;
    local_78 = num % local_64;
    local_7c = local_78 - div;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_7c);
    div = local_78;
  }
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  n = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&n);
    if (!bVar1) break;
    local_228 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end1);
    if (*local_228 != 0) {
      val_to_rnum_abi_cxx11_(&local_248,*local_228);
      std::operator<<((ostream *)&__range1,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string num_to_roman(uint32_t num)
{
	auto size = std::to_string(num).size();
	std::vector<uint32_t> nums;
	uint32_t prev{ 0 };
	for (int i = 0; i != size; ++i)
	{
		auto div = static_cast<uint32_t>(std::pow(10, (i + 1)));
		auto curr = num % div;
		nums.push_back(curr - prev);
		prev = curr;
	}
	std::reverse(nums.begin(), nums.end());
	std::ostringstream oss;
	for (auto& n : nums)
	{
		if (n != 0)
		{
			oss << val_to_rnum(n);
		}
	}
	return oss.str();
}